

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void lj_gc_closeuv(global_State *g,GCupval *uv)

{
  GCobj *o;
  GCupval *uv_local;
  global_State *g_local;
  
  (uv->field_5).tv = *(TValue *)(uv->v).ptr64;
  (uv->v).ptr64 = (uint64_t)&uv->field_5;
  uv->closed = '\x01';
  (uv->nextgc).gcptr64 = (g->gc).root.gcptr64;
  (g->gc).root.gcptr64 = (uint64_t)uv;
  if ((uv->marked & 7) == 0) {
    if (((g->gc).state == '\x01') || ((g->gc).state == '\x02')) {
      uv->marked = uv->marked | 4;
      if ((0xfffffff6 < (int)((long)(uv->field_5).field_1.prev.gcptr64 >> 0x2f) + 4U) &&
         ((*(byte *)(((uv->field_5).tv & 0x7fffffffffff) + 8) & 3) != 0)) {
        lj_gc_barrierf(g,(GCobj *)uv,(GCobj *)((uv->field_5).tv & 0x7fffffffffff));
      }
    }
    else {
      uv->marked = uv->marked & 0xf8 | (g->gc).currentwhite & 3;
    }
  }
  return;
}

Assistant:

void lj_gc_closeuv(global_State *g, GCupval *uv)
{
  GCobj *o = obj2gco(uv);
  /* Copy stack slot to upvalue itself and point to the copy. */
  copyTV(mainthread(g), &uv->tv, uvval(uv));
  setmref(uv->v, &uv->tv);
  uv->closed = 1;
  setgcrefr(o->gch.nextgc, g->gc.root);
  setgcref(g->gc.root, o);
  if (isgray(o)) {  /* A closed upvalue is never gray, so fix this. */
    if (g->gc.state == GCSpropagate || g->gc.state == GCSatomic) {
      gray2black(o);  /* Make it black and preserve invariant. */
      if (tviswhite(&uv->tv))
	lj_gc_barrierf(g, o, gcV(&uv->tv));
    } else {
      makewhite(g, o);  /* Make it white, i.e. sweep the upvalue. */
      lj_assertG(g->gc.state != GCSfinalize && g->gc.state != GCSpause,
		 "bad GC state");
    }
  }
}